

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall Engine::btToLevel(Engine *this,int level)

{
  ostream *poVar1;
  string local_48;
  
  if (so.debug) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Engine::btToLevel( ",0x13);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,level);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
  }
  if ((this->trail_lim).sz != 0 || level != 0) {
    btToPos(this,(this->trail_lim).data[(uint)level]);
    (this->trail_lim).sz = level;
    if (so.debug == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"trail_lim is now: ",0x12);
      showVec_abi_cxx11_(&local_48,&this->trail_lim);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_48._M_dataplus._M_p,local_48._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    (this->dec_info).sz = level;
  }
  return;
}

Assistant:

void Engine::btToLevel(int level) {
	if (so.debug) {
		std::cerr << "Engine::btToLevel( " << level << ")\n";
	}
	if (decisionLevel() == 0 && level == 0) {
		return;
	}
	assert(decisionLevel() > level);

	btToPos(trail_lim[level]);
	trail_lim.resize(level);
	if (so.debug) {
		std::cerr << "trail_lim is now: " << showVec(trail_lim) << "\n";
	}
	dec_info.resize(level);
#ifdef HAS_VAR_IMPACT
	last_int = nullptr;
#endif
}